

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O1

bool absl::lts_20250127::container_internal::operator==(iterator *a,iterator *b)

{
  slot_type *ppFVar1;
  slot_type *ppFVar2;
  slot_type *ppFVar3;
  slot_type *ppFVar4;
  slot_type *ppFVar5;
  bool bVar6;
  slot_type *ppFVar7;
  
  ppFVar1 = (slot_type *)a->ctrl_;
  if ((ppFVar1 == (slot_type *)(kEmptyGroup + 0x10) || ppFVar1 == (slot_type *)0x0) ||
     (kSentinel < *(ctrl_t *)ppFVar1)) {
    ppFVar2 = (slot_type *)b->ctrl_;
    if ((ppFVar2 != (slot_type *)(kEmptyGroup + 0x10) && ppFVar2 != (slot_type *)0x0) &&
       (*(ctrl_t *)ppFVar2 < ~kSentinel)) goto LAB_001d831a;
    if (ppFVar1 == (slot_type *)(kEmptyGroup + 0x10) && ppFVar2 == (slot_type *)(kEmptyGroup + 0x10)
       ) {
LAB_001d830d:
      return ppFVar1 == ppFVar2;
    }
    if ((ppFVar1 == (slot_type *)(kEmptyGroup + 0x10)) ==
        (ppFVar2 == (slot_type *)(kEmptyGroup + 0x10))) {
      if (ppFVar1 == (slot_type *)0x0 || ppFVar2 == (slot_type *)0x0) goto LAB_001d830d;
      if ((ppFVar2 == (slot_type *)kSooControl) == (ppFVar1 == (slot_type *)kSooControl)) {
        ppFVar3 = (a->field_1).slot_;
        ppFVar4 = (b->field_1).slot_;
        if (ppFVar1 == (slot_type *)kSooControl) {
          bVar6 = ppFVar3 == ppFVar4;
        }
        else {
          ppFVar7 = ppFVar4;
          ppFVar5 = ppFVar2;
          if (ppFVar2 < ppFVar1) {
            ppFVar7 = ppFVar3;
            ppFVar5 = ppFVar1;
            ppFVar3 = ppFVar4;
          }
          bVar6 = ppFVar3 <= ppFVar7 && ppFVar5 < ppFVar3;
        }
        if (bVar6) goto LAB_001d830d;
      }
      goto LAB_001d8324;
    }
  }
  else {
    operator==();
LAB_001d831a:
    operator==();
  }
  operator==();
LAB_001d8324:
  operator==();
}

Assistant:

bool operator==(const iterator& a, const iterator& b) {
      AssertIsValidForComparison(a.ctrl_, a.generation(), a.generation_ptr());
      AssertIsValidForComparison(b.ctrl_, b.generation(), b.generation_ptr());
      AssertSameContainer(a.ctrl_, b.ctrl_, a.slot_, b.slot_,
                          a.generation_ptr(), b.generation_ptr());
      return a.ctrl_ == b.ctrl_;
    }